

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_map_custom1_impl
          (ggml_context *ctx,ggml_tensor *a,ggml_custom1_op_t fun,int n_tasks,void *userdata,
          _Bool inplace)

{
  ggml_tensor *params_00;
  int in_ECX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  byte in_R9B;
  ggml_map_custom1_op_params params;
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffffa8;
  ggml_context *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  ggml_context *in_stack_ffffffffffffffc0;
  
  if ((in_ECX != -1) && (in_ECX < 1)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x1322,"GGML_ASSERT(%s) failed","n_tasks == GGML_N_TASKS_MAX || n_tasks > 0");
  }
  if ((in_R9B & 1) == 0) {
    params_00 = ggml_dup_tensor(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    params_00 = ggml_view_tensor(in_stack_ffffffffffffffc0,
                                 (ggml_tensor *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  ggml_set_op_params(in_RDX,params_00,0x1539fc);
  params_00->op = GGML_OP_MAP_CUSTOM1;
  params_00->src[0] = in_RSI;
  return params_00;
}

Assistant:

static struct ggml_tensor * ggml_map_custom1_impl(
        struct ggml_context      * ctx,
        struct ggml_tensor       * a,
        const  ggml_custom1_op_t   fun,
        int                        n_tasks,
        void                     * userdata,
        bool                       inplace) {
    GGML_ASSERT(n_tasks == GGML_N_TASKS_MAX || n_tasks > 0);

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    struct ggml_map_custom1_op_params params = {
        /*.fun      =*/ fun,
        /*.n_tasks  =*/ n_tasks,
        /*.userdata =*/ userdata
    };
    ggml_set_op_params(result, &params, sizeof(params));

    result->op     = GGML_OP_MAP_CUSTOM1;
    result->src[0] = a;

    return result;
}